

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O3

void __thiscall
testing::UnitTest::RecordPropertyForCurrentTest(UnitTest *this,char *key,char *value)

{
  TestInfo *pTVar1;
  TestResult *this_00;
  TestProperty test_property;
  TestProperty local_28;
  
  TestProperty::TestProperty(&local_28,key,value);
  pTVar1 = this->impl_->current_test_info_;
  if (pTVar1 == (TestInfo *)0x0) {
    this_00 = &this->impl_->ad_hoc_test_result_;
  }
  else {
    this_00 = &pTVar1->impl_->result_;
  }
  TestResult::RecordProperty(this_00,&local_28);
  if (local_28.value_.c_str_ != (char *)0x0) {
    operator_delete__(local_28.value_.c_str_);
  }
  if (local_28.key_.c_str_ != (char *)0x0) {
    operator_delete__(local_28.key_.c_str_);
  }
  return;
}

Assistant:

void UnitTest::RecordPropertyForCurrentTest(const char* key,
                                            const char* value) {
  const TestProperty test_property(key, value);
  impl_->current_test_result()->RecordProperty(test_property);
}